

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O0

void fmt::v11::vprint(ostream *os,string_view fmt,format_args args)

{
  buffer<char> *in_RCX;
  basic_ostream<char,_std::char_traits<char>_> *in_R8;
  FILE *f;
  memory_buffer buffer;
  _IO_FILE *in_stack_fffffffffffffd78;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *in_stack_fffffffffffffd80;
  locale_ref local_270;
  buffer<char> *in_stack_fffffffffffffe68;
  locale_ref in_stack_fffffffffffffe70;
  format_args in_stack_fffffffffffffe78;
  string_view in_stack_fffffffffffffe88;
  
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd80,(allocator<char> *)in_stack_fffffffffffffd78);
  detail::locale_ref::locale_ref(&local_270);
  detail::vformat_to(in_stack_fffffffffffffe68,in_stack_fffffffffffffe88,in_stack_fffffffffffffe78,
                     in_stack_fffffffffffffe70);
  detail::ignore_unused<_IO_FILE*>((_IO_FILE **)&stack0xfffffffffffffd78);
  detail::write_buffer<char>(in_R8,in_RCX);
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> *)0x1ff429);
  return;
}

Assistant:

inline void vprint(std::ostream& os, string_view fmt, format_args args) {
  auto buffer = memory_buffer();
  detail::vformat_to(buffer, fmt, args);
  FILE* f = nullptr;
#if FMT_MSVC_STL_UPDATE && FMT_USE_RTTI
  if (auto* buf = dynamic_cast<std::filebuf*>(os.rdbuf()))
    f = detail::get_file(*buf);
#elif defined(_WIN32) && defined(__GLIBCXX__) && FMT_USE_RTTI
  auto* rdbuf = os.rdbuf();
  if (auto* sfbuf = dynamic_cast<__gnu_cxx::stdio_sync_filebuf<char>*>(rdbuf))
    f = sfbuf->file();
  else if (auto* fbuf = dynamic_cast<__gnu_cxx::stdio_filebuf<char>*>(rdbuf))
    f = fbuf->file();
#endif
#ifdef _WIN32
  if (f) {
    int fd = _fileno(f);
    if (_isatty(fd)) {
      os.flush();
      if (detail::write_console(fd, {buffer.data(), buffer.size()})) return;
    }
  }
#endif
  detail::ignore_unused(f);
  detail::write_buffer(os, buffer);
}